

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::writeHeader(QPDFWriter *this)

{
  element_type *peVar1;
  size_t in_RCX;
  void *__buf;
  int __fd;
  
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x25f8f6,(void *)0x5,in_RCX);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ::qpdf::pl::Count::write
            (peVar1->pipeline,(int)(peVar1->final_pdf_version)._M_dataplus._M_p,
             (void *)(peVar1->final_pdf_version)._M_string_length,in_RCX);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->pclm == true) {
    __fd = 0x27adca;
    __buf = (void *)0xb;
  }
  else {
    __fd = 0x27add6;
    __buf = (void *)0x7;
  }
  ::qpdf::pl::Count::write(peVar1->pipeline,__fd,__buf,in_RCX);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar1->pipeline,0x27adde,(void *)0xa,in_RCX);
    return;
  }
  return;
}

Assistant:

void
QPDFWriter::writeHeader()
{
    writeString("%PDF-");
    writeString(m->final_pdf_version);
    if (m->pclm) {
        // PCLm version
        writeString("\n%PCLm 1.0\n");
    } else {
        // This string of binary characters would not be valid UTF-8, so it really should be treated
        // as binary.
        writeString("\n%\xbf\xf7\xa2\xfe\n");
    }
    writeStringQDF("%QDF-1.0\n\n");

    // Note: do not write extra header text here.  Linearized PDFs must include the entire
    // linearization parameter dictionary within the first 1024 characters of the PDF file, so for
    // linearized files, we have to write extra header text after the linearization parameter
    // dictionary.
}